

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_InParentNamespace_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  char *pcVar3;
  int local_34;
  flatcc_builder_ref_t *pfStack_30;
  int more;
  flatcc_builder_ref_t *result_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *result = 0;
  pfStack_30 = result;
  result_local = (flatcc_builder_ref_t *)end;
  end_local = buf;
  buf_local = (char *)ctx;
  iVar1 = flatcc_builder_start_table(ctx->ctx,0);
  if (iVar1 == 0) {
    end_local = flatcc_json_parser_object_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                           &local_34);
    while (local_34 != 0) {
      end_local = flatcc_json_parser_symbol_start
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      end_local = flatcc_json_parser_unmatched_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      end_local = flatcc_json_parser_object_end
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                             &local_34);
    }
    if (*(int *)(buf_local + 0x20) == 0) {
      fVar2 = flatcc_builder_end_table(*(flatcc_builder_t **)buf_local);
      *pfStack_30 = fVar2;
      if (fVar2 != 0) {
        return end_local;
      }
    }
  }
  pcVar3 = flatcc_json_parser_set_error
                     ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,0x23);
  return pcVar3;
}

Assistant:

static const char *MyGame_InParentNamespace_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 0)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        /* Table has no fields. */
        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}